

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ShowPlaceholderObject(char *prefix,int uid)

{
  bool bVar1;
  float *v;
  int i;
  ulong uVar2;
  
  ImGui::PushID(uid);
  ImGui::TableNextRow(0,0.0);
  ImGui::TableSetColumnIndex(0);
  ImGui::AlignTextToFramePadding();
  bVar1 = ImGui::TreeNode("Object","%s_%u",prefix,uid);
  ImGui::TableSetColumnIndex(1);
  ImGui::Text("my sailor is rich");
  if (bVar1) {
    v = ShowPlaceholderObject::placeholder_members;
    uVar2 = 0;
    do {
      ImGui::PushID((int)uVar2);
      if (uVar2 < 2) {
        ShowPlaceholderObject("Child",0x67932);
      }
      else {
        ImGui::TableNextRow(0,0.0);
        ImGui::TableSetColumnIndex(0);
        ImGui::AlignTextToFramePadding();
        ImGui::TreeNodeEx("Field",0x308,"Field_%d");
        ImGui::TableSetColumnIndex(1);
        ImGui::SetNextItemWidth(-1.1754944e-38);
        if (uVar2 < 5) {
          ImGui::DragFloat("##value",v,0.01,0.0,0.0,"%.3f",0);
        }
        else {
          ImGui::InputFloat("##value",v,1.0,0.0,"%.3f",0);
        }
        ImGui::NextColumn();
      }
      ImGui::PopID();
      uVar2 = uVar2 + 1;
      v = v + 1;
    } while (uVar2 != 8);
    ImGui::TreePop();
  }
  ImGui::PopID();
  return;
}

Assistant:

static void ShowPlaceholderObject(const char* prefix, int uid)
{
    // Use object uid as identifier. Most commonly you could also use the object pointer as a base ID.
    ImGui::PushID(uid);

    // Text and Tree nodes are less high than framed widgets, using AlignTextToFramePadding() we add vertical spacing to make the tree lines equal high.
    ImGui::TableNextRow();
    ImGui::TableSetColumnIndex(0);
    ImGui::AlignTextToFramePadding();
    bool node_open = ImGui::TreeNode("Object", "%s_%u", prefix, uid);
    ImGui::TableSetColumnIndex(1);
    ImGui::Text("my sailor is rich");

    if (node_open)
    {
        static float placeholder_members[8] = { 0.0f, 0.0f, 1.0f, 3.1416f, 100.0f, 999.0f };
        for (int i = 0; i < 8; i++)
        {
            ImGui::PushID(i); // Use field index as identifier.
            if (i < 2)
            {
                ShowPlaceholderObject("Child", 424242);
            }
            else
            {
                // Here we use a TreeNode to highlight on hover (we could use e.g. Selectable as well)
                ImGui::TableNextRow();
                ImGui::TableSetColumnIndex(0);
                ImGui::AlignTextToFramePadding();
                ImGuiTreeNodeFlags flags = ImGuiTreeNodeFlags_Leaf | ImGuiTreeNodeFlags_NoTreePushOnOpen | ImGuiTreeNodeFlags_Bullet;
                ImGui::TreeNodeEx("Field", flags, "Field_%d", i);

                ImGui::TableSetColumnIndex(1);
                ImGui::SetNextItemWidth(-FLT_MIN);
                if (i >= 5)
                    ImGui::InputFloat("##value", &placeholder_members[i], 1.0f);
                else
                    ImGui::DragFloat("##value", &placeholder_members[i], 0.01f);
                ImGui::NextColumn();
            }
            ImGui::PopID();
        }
        ImGui::TreePop();
    }
    ImGui::PopID();
}